

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstatusnotifieritemadaptor.cpp
# Opt level: O1

void __thiscall
QStatusNotifierItemAdaptor::ProvideXdgActivationToken
          (QStatusNotifierItemAdaptor *this,QString *token)

{
  int *piVar1;
  QLoggingCategory *pQVar2;
  char16_t *pcVar3;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QString local_40;
  char *local_28;
  QDebug local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = QtPrivateLogging::qLcTray();
  if (((pQVar2->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
    local_28 = pQVar2->name;
    local_40.d.d._0_4_ = 2;
    local_40.d.d._4_4_ = 0;
    local_40.d.ptr._0_4_ = 0;
    local_40.d.ptr._4_4_ = 0;
    local_40.d.size._0_4_ = 0;
    local_40.d.size._4_4_ = 0;
    QMessageLogger::debug();
    pcVar3 = (token->d).ptr;
    if (pcVar3 == (char16_t *)0x0) {
      pcVar3 = (char16_t *)&QString::_empty;
    }
    QDebug::putString((QChar *)&local_20,(ulong)pcVar3);
    if ((local_20.stream)->space == true) {
      QTextStream::operator<<(&(local_20.stream)->ts,' ');
    }
    QDebug::~QDebug(&local_20);
  }
  QString::toUtf8_helper(&local_40);
  QVar4.m_data._4_4_ = local_40.d.ptr._4_4_;
  QVar4.m_data._0_4_ = local_40.d.ptr._0_4_;
  QVar4.m_size._4_4_ = local_40.d.size._4_4_;
  QVar4.m_size._0_4_ = (undefined4)local_40.d.size;
  qputenv("XDG_ACTIVATION_TOKEN",QVar4);
  piVar1 = (int *)CONCAT44(local_40.d.d._4_4_,local_40.d.d._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_40.d.d._4_4_,local_40.d.d._0_4_),1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStatusNotifierItemAdaptor::ProvideXdgActivationToken(const QString &token)
{
    qCDebug(qLcTray) << token;
    qputenv("XDG_ACTIVATION_TOKEN", token.toUtf8());
}